

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::
     SpecializeArgMinMaxNFunction<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>
               (AggregateFunction *function)

{
  AggregateFunction *function_local;
  
  function->state_size =
       AggregateFunction::
       StateSize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
  ;
  function->initialize =
       AggregateFunction::
       StateInitialize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation,(duckdb::AggregateDestructorType)1>
  ;
  function->combine =
       AggregateFunction::
       StateCombine<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
  ;
  function->destructor =
       AggregateFunction::
       StateDestroy<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>,duckdb::MinMaxNOperation>
  ;
  function->finalize =
       MinMaxNOperation::
       Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
  ;
  function->update =
       ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
  ;
  return;
}

Assistant:

static void SpecializeArgMinMaxNFunction(AggregateFunction &function) {
	using STATE = ArgMinMaxNState<VAL_TYPE, ARG_TYPE, COMPARATOR>;
	using OP = MinMaxNOperation;

	function.state_size = AggregateFunction::StateSize<STATE>;
	function.initialize = AggregateFunction::StateInitialize<STATE, OP, AggregateDestructorType::LEGACY>;
	function.combine = AggregateFunction::StateCombine<STATE, OP>;
	function.destructor = AggregateFunction::StateDestroy<STATE, OP>;

	function.finalize = MinMaxNOperation::Finalize<STATE>;
	function.update = ArgMinMaxNUpdate<STATE>;
}